

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  bool bVar12;
  stbtt__buf fontdict;
  float fVar13;
  stbtt_uint32 sVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  undefined1 uVar18;
  uchar uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uchar *puVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  float fVar36;
  float dy1;
  float fVar37;
  float dy2;
  float fVar38;
  float dx3;
  float fVar39;
  float fVar40;
  stbtt__buf b;
  stbtt__buf sVar41;
  undefined4 in_stack_fffffffffffffda0;
  int iVar42;
  undefined4 uVar43;
  uint uStack_250;
  uint uStack_24c;
  int iVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  ulong uVar47;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar26 = (info->subrs).data;
  local_108.cursor = (info->subrs).cursor;
  local_108.size = (info->subrs).size;
  sVar41 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar35 = sVar41._8_8_;
  uVar43 = sVar41.data._0_4_;
  iVar30 = sVar41.data._4_4_;
  uStack_24c = sVar41.size;
  if ((int)uStack_24c <= sVar41.cursor) {
switchD_0021568f_default:
    return 0;
  }
  local_108.data = puVar26;
  local_e0 = &(info->gsubrs).cursor;
  iVar42 = 1;
  iVar16 = 0;
  uVar47 = 0;
  iVar44 = 0;
  uVar33 = 0;
  local_1d0 = info;
LAB_002153ee:
  fVar36 = s[0xb];
  dy2 = s[9];
  fVar13 = s[8];
  dy1 = s[7];
  dx3 = s[6];
  fVar40 = s[5];
  fVar39 = s[4];
  fVar38 = s[3];
  fVar37 = s[2];
  uVar21 = (uint)uVar35;
  uStack_250 = uVar21 + 1;
  bVar11 = *(byte *)(CONCAT44(iVar30,uVar43) + (long)(int)uVar21);
  uVar32 = (uint)uVar33;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar16 = iVar16 + ((int)((int)(uVar33 >> 0x1f) + uVar32) >> 1);
    goto LAB_0021608f;
  default:
    if (bVar11 < 0x20 && bVar11 != 0x1c) {
      return 0;
    }
    if (bVar11 == 0xff) {
      uVar21 = 0;
      iVar24 = 4;
      do {
        if ((int)uStack_250 < (int)uStack_24c) {
          lVar28 = (long)(int)uStack_250;
          uStack_250 = uStack_250 + 1;
          uVar22 = (uint)*(byte *)(CONCAT44(iVar30,uVar43) + lVar28);
        }
        else {
          uVar22 = 0;
        }
        uVar21 = uVar21 << 8 | uVar22;
        iVar24 = iVar24 + -1;
      } while (iVar24 != 0);
      fVar36 = (float)(int)uVar21 * 1.5258789e-05;
    }
    else {
      if ((int)uStack_24c < (int)uVar21) {
        uVar21 = uStack_24c;
      }
      bVar12 = (int)uStack_250 < 1;
      uStack_250 = uVar21;
      if (bVar12) {
        uStack_250 = uStack_24c;
      }
      sVar14 = stbtt__cff_int((stbtt__buf *)&stack0xfffffffffffffda8);
      fVar36 = (float)(int)(short)sVar14;
    }
    if (0x2f < (int)uVar32) {
      return 0;
    }
    s[(int)uVar32] = fVar36;
    uVar34 = (ulong)(uVar32 + 1);
    break;
  case 4:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar37 = s[uVar32 - 1];
    fVar36 = 0.0;
    goto LAB_002158de;
  case 5:
    if ((int)uVar32 < 2) {
      return 0;
    }
    uVar35 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar36 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar35 - 1));
      fVar37 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar35 - 1)) >> 0x20);
      c->x = fVar36;
      c->y = fVar37;
      uVar34 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
      uVar35 = uVar35 + 2;
    } while (uVar35 < uVar33);
    break;
  case 6:
    iVar24 = 0;
    if ((int)uVar32 < 1) {
      return 0;
    }
    for (; iVar24 < (int)uVar32; iVar24 = iVar24 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar36 = s[iVar24];
      c->x = fVar36 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar36 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar24 = iVar24 + 1;
LAB_00216037:
      if ((int)uVar32 <= iVar24) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar36 = s[iVar24];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar36 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar36 + (float)uVar10),0,0,0,0);
    }
    goto LAB_0021608f;
  case 7:
    iVar24 = 0;
    if (0 < (int)uVar32) goto LAB_00216037;
    return 0;
  case 8:
    if ((int)uVar32 < 6) {
      return 0;
    }
    uVar35 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar35 - 1],afStack_1d8[uVar35],afStack_1d8[uVar35 + 1],s[uVar35 - 2]
                 ,s[uVar35 - 1],s[uVar35]);
      uVar35 = uVar35 + 6;
    } while (uVar35 < uVar33);
    goto LAB_0021608f;
  case 10:
    iVar24 = 1;
    if ((iVar44 == 0) && (uVar21 = (local_1d0->fdselect).size, uVar21 != 0)) {
      puVar26 = (local_1d0->fdselect).data;
      uVar19 = '\0';
      uVar22 = 0;
      if ((int)uVar21 < 0) {
        uVar22 = uVar21;
      }
      if (0 < (int)uVar21) {
        uVar19 = puVar26[uVar22];
        uVar22 = 1;
      }
      if (uVar19 == '\0') {
        uVar22 = uVar22 + glyph_index;
        uVar25 = uVar22;
        if ((int)uVar21 < (int)uVar22) {
          uVar25 = uVar21;
        }
        if ((int)uVar22 < 0) {
          uVar25 = uVar21;
        }
        uVar20 = 0;
        if ((int)uVar25 < (int)uVar21) {
          uVar20 = (uint)puVar26[(int)uVar25];
        }
      }
      else {
        if (uVar19 == '\x03') {
          uVar25 = 0;
          iVar44 = 2;
          do {
            if ((int)uVar22 < (int)uVar21) {
              lVar28 = (long)(int)uVar22;
              uVar22 = uVar22 + 1;
              uVar20 = (uint)puVar26[lVar28];
            }
            else {
              uVar20 = 0;
            }
            uVar25 = uVar25 << 8 | uVar20;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          uVar27 = 0;
          iVar44 = 2;
          do {
            if ((int)uVar22 < (int)uVar21) {
              lVar28 = (long)(int)uVar22;
              uVar22 = uVar22 + 1;
              uVar20 = (uint)puVar26[lVar28];
            }
            else {
              uVar20 = 0;
            }
            uVar27 = uVar27 << 8 | uVar20;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          if (0 < (int)uVar25) {
            uVar29 = 0;
            do {
              if ((int)uVar22 < (int)uVar21) {
                lVar28 = (long)(int)uVar22;
                uVar22 = uVar22 + 1;
                uVar20 = (uint)puVar26[lVar28];
              }
              else {
                uVar20 = 0;
              }
              uVar31 = 0;
              iVar44 = 2;
              do {
                if ((int)uVar22 < (int)uVar21) {
                  lVar28 = (long)(int)uVar22;
                  uVar22 = uVar22 + 1;
                  uVar23 = (uint)puVar26[lVar28];
                }
                else {
                  uVar23 = 0;
                }
                uVar31 = uVar31 << 8 | uVar23;
                iVar44 = iVar44 + -1;
              } while (iVar44 != 0);
              if (glyph_index < (int)uVar31 && (int)uVar27 <= glyph_index) goto LAB_00215db3;
              uVar29 = uVar29 + 1;
              uVar27 = uVar31;
            } while (uVar29 != uVar25);
          }
        }
        uVar20 = 0xffffffff;
      }
LAB_00215db3:
      puVar26 = (local_1d0->cff).data;
      uVar45 = SUB84(puVar26,0);
      uVar46 = (undefined4)((ulong)puVar26 >> 0x20);
      stbtt__cff_index_get(local_1d0->fontdicts,uVar20);
      sVar41.data._4_4_ = iVar42;
      sVar41.data._0_4_ = in_stack_fffffffffffffda0;
      sVar41.cursor = uVar43;
      sVar41.size = iVar30;
      fontdict.data._4_4_ = uVar46;
      fontdict.data._0_4_ = uVar45;
      fontdict.cursor = (int)uVar47;
      fontdict.size = (int)(uVar47 >> 0x20);
      local_108 = stbtt__get_subrs(sVar41,fontdict);
      iVar24 = 1;
    }
    goto LAB_00215e04;
  case 0xb:
    if ((int)uVar47 < 1) {
      return 0;
    }
    uVar47 = (ulong)((int)uVar47 - 1);
    uVar43 = *(undefined4 *)&subr_stack[uVar47].data;
    iVar30 = *(int *)((long)&subr_stack[uVar47].data + 4);
    uStack_250 = subr_stack[uVar47].cursor;
    uStack_24c = subr_stack[uVar47].size;
    uVar34 = uVar33;
    break;
  case 0xc:
    lVar28 = (long)(int)uStack_250;
    uVar18 = 0;
    if ((int)uStack_250 < (int)uStack_24c) {
      uStack_250 = uVar21 + 2;
      uVar18 = *(undefined1 *)(CONCAT44(iVar30,uVar43) + lVar28);
    }
    switch(uVar18) {
    case 0x22:
      if ((int)uVar32 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar37;
      dy1 = 0.0;
      fVar36 = 0.0;
      break;
    case 0x23:
      if ((int)uVar32 < 0xd) {
        return 0;
      }
      local_f8 = s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar39 = dx3;
      fVar40 = fVar13;
      dx3 = local_f8;
      break;
    case 0x24:
      if ((int)uVar32 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar36 = -(local_f8 + fVar38 + dy1);
      fVar39 = fVar40;
      dy2 = dy1;
      fVar40 = dx3;
      dy1 = 0.0;
      dx3 = fVar13;
      break;
    case 0x25:
      if ((int)uVar32 < 0xb) {
        return 0;
      }
      fVar36 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar38 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar39 = ABS(fVar36);
      fVar40 = ABS(fVar38);
      fVar37 = s[10];
      if (fVar39 <= fVar40) {
        fVar37 = -fVar36;
      }
      uVar21 = -(uint)(fVar40 < fVar39);
      fVar36 = (float)(~uVar21 & (uint)s[10] | (uint)-fVar38 & uVar21);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar39 = dx3;
      fVar40 = fVar13;
      dx3 = fVar37;
      break;
    default:
      goto switchD_0021568f_default;
    }
    goto LAB_002157fb;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar42 != 0) {
      iVar16 = iVar16 + ((int)((int)(uVar33 >> 0x1f) + uVar32) >> 1);
    }
    iVar42 = iVar16 + 0xe;
    if (-1 < iVar16 + 7) {
      iVar42 = iVar16 + 7;
    }
    uVar21 = (iVar42 >> 3) + uStack_250;
    uStack_250 = uVar21;
    if ((int)uStack_24c < (int)uVar21) {
      uStack_250 = uStack_24c;
    }
    if ((int)uVar21 < 0) {
      uStack_250 = uStack_24c;
    }
    goto LAB_00215a97;
  case 0x15:
    if ((int)uVar32 < 2) {
      return 0;
    }
    fVar36 = s[uVar32 - 2];
    fVar37 = s[uVar32 - 1];
    goto LAB_002158de;
  case 0x16:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar36 = s[uVar32 - 1];
    fVar37 = 0.0;
LAB_002158de:
    stbtt__csctx_rmove_to(c,fVar36,fVar37);
LAB_00215a97:
    iVar42 = 0;
    uVar34 = 0;
    break;
  case 0x18:
    if ((int)uVar32 < 8) {
      return 0;
    }
    lVar28 = -6;
    do {
      lVar15 = lVar28;
      stbtt__csctx_rccurve_to
                (c,s[lVar15 + 6],s[lVar15 + 7],s[lVar15 + 8],s[lVar15 + 9],s[lVar15 + 10],
                 s[lVar15 + 0xb]);
      lVar28 = lVar15 + 6;
    } while (lVar15 + 6 < (long)(int)uVar32 + -0xd);
    if ((int)uVar32 <= (int)lVar15 + 0xd) {
      return 0;
    }
    uVar1 = c->x;
    uVar6 = c->y;
    fVar36 = (float)uVar1 + (float)*(undefined8 *)(s + lVar15 + 0xc);
    fVar37 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + lVar15 + 0xc) >> 0x20);
    c->x = fVar36;
    c->y = fVar37;
    stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
    uVar34 = 0;
    break;
  case 0x19:
    if ((int)uVar32 < 8) {
      return 0;
    }
    lVar28 = 5;
    do {
      lVar15 = lVar28;
      uVar3 = c->x;
      uVar8 = c->y;
      fVar36 = (float)uVar3 + (float)*(undefined8 *)(afStack_1d8 + lVar15 + -1);
      fVar37 = (float)uVar8 + (float)((ulong)*(undefined8 *)(afStack_1d8 + lVar15 + -1) >> 0x20);
      c->x = fVar36;
      c->y = fVar37;
      stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
      lVar28 = lVar15 + 2;
    } while (lVar15 + -2 < (long)(int)(uVar32 - 6));
    if ((int)uVar32 <= (int)lVar28) {
      return 0;
    }
    fVar36 = s[lVar28];
    fVar39 = afStack_1d8[lVar15 + 1];
    dy2 = s[lVar15];
    fVar40 = afStack_1d8[lVar15 + 3];
    dy1 = afStack_1d8[lVar28];
    dx3 = s[lVar15 + 1];
LAB_002157fb:
    stbtt__csctx_rccurve_to(c,fVar39,dy1,fVar40,dy2,dx3,fVar36);
    goto LAB_0021608f;
  case 0x1a:
  case 0x1b:
    if ((int)uVar32 < 4) {
      return 0;
    }
    uVar35 = (ulong)(uVar32 & 1);
    if ((int)((uVar32 & 1) + 3) < (int)uVar32) {
      fVar36 = 0.0;
      if ((uVar33 & 1) != 0) {
        fVar36 = s[0];
      }
      do {
        iVar24 = (int)uVar35;
        fVar37 = s[uVar35];
        if (bVar11 == 0x1b) {
          fVar39 = fVar37;
          fVar40 = 0.0;
          fVar38 = s[iVar24 + 3];
          fVar37 = fVar36;
        }
        else {
          fVar38 = 0.0;
          fVar39 = fVar36;
          fVar40 = s[iVar24 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar39,fVar37,s[uVar35 + 1],s[uVar35 + 2],fVar38,fVar40);
        uVar35 = uVar35 + 4;
        fVar36 = 0.0;
      } while (iVar24 + 7 < (int)uVar32);
    }
    goto LAB_0021608f;
  case 0x1d:
    iVar24 = iVar44;
LAB_00215e04:
    if ((int)uVar32 < 1) {
      return 0;
    }
    iVar44 = (int)uVar47;
    if (9 < iVar44) {
      return 0;
    }
    fVar36 = s[uVar32 - 1];
    *(undefined4 *)&subr_stack[iVar44].data = uVar43;
    *(int *)((long)&subr_stack[iVar44].data + 4) = iVar30;
    subr_stack[iVar44].cursor = uStack_250;
    subr_stack[iVar44].size = uStack_24c;
    piVar17 = &local_108.cursor;
    puVar26 = local_108.data;
    if (bVar11 != 10) {
      puVar26 = (local_1d0->gsubrs).data;
      piVar17 = local_e0;
    }
    uVar47 = (ulong)(iVar44 + 1);
    uVar22 = (uint)(*(ulong *)piVar17 >> 0x20);
    uVar25 = (int)uVar22 >> 0x1f & uVar22;
    uVar21 = 0;
    iVar30 = 2;
    do {
      if ((int)uVar25 < (int)uVar22) {
        lVar28 = (long)(int)uVar25;
        uVar25 = uVar25 + 1;
        uVar20 = (uint)puVar26[lVar28];
      }
      else {
        uVar20 = 0;
      }
      uVar21 = uVar21 << 8 | uVar20;
      iVar30 = iVar30 + -1;
    } while (iVar30 != 0);
    uVar22 = (uint)(0x4d7 < (int)uVar21) << 10 | 0x6b;
    if (0x846b < (int)uVar21) {
      uVar22 = 0x8000;
    }
    iVar30 = uVar22 + (int)fVar36;
    sVar41 = (stbtt__buf)ZEXT816(0);
    if (iVar30 < (int)uVar21 && -1 < iVar30) {
      b._8_8_ = (ulong)uVar25 | *(ulong *)piVar17 & 0xffffffff00000000;
      b.data = puVar26;
      sVar41 = stbtt__cff_index_get(b,iVar30);
    }
    uVar43 = sVar41.data._0_4_;
    iVar30 = sVar41.data._4_4_;
    uStack_24c = sVar41.size;
    if (uStack_24c == 0) {
      return 0;
    }
    uStack_250 = 0;
    uVar34 = (ulong)(uVar32 - 1);
    iVar44 = iVar24;
    break;
  case 0x1e:
    iVar24 = 0;
    if ((int)uVar32 < 4) {
      return 0;
    }
    for (; iVar24 + 3 < (int)uVar32; iVar24 = iVar24 + 4) {
      fVar36 = 0.0;
      if (uVar32 - iVar24 == 5) {
        fVar36 = s[(long)iVar24 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar24],s[(long)iVar24 + 1],s[(long)iVar24 + 2],s[iVar24 + 3],fVar36);
      iVar24 = iVar24 + 4;
LAB_00215f8b:
      if ((int)uVar32 <= iVar24 + 3) break;
      fVar36 = 0.0;
      if (uVar32 - iVar24 == 5) {
        fVar36 = s[(long)iVar24 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar24],0.0,s[(long)iVar24 + 1],s[(long)iVar24 + 2],fVar36,s[iVar24 + 3]);
    }
LAB_0021608f:
    uVar34 = 0;
    break;
  case 0x1f:
    iVar24 = 0;
    if (3 < (int)uVar32) goto LAB_00215f8b;
    return 0;
  }
  uVar35 = (ulong)uStack_250;
  uVar33 = uVar34;
  if ((int)uStack_24c <= (int)uStack_250) {
    return 0;
  }
  goto LAB_002153ee;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // FALLTHROUGH
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && b0 < 32)
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}